

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Warfare_Header::Warfare_Header
          (Warfare_Header *this,EntityIdentifier *FiringEntID,EntityIdentifier *TargetEntID,
          EntityIdentifier *MunitionID,EntityIdentifier *EventID)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Warfare_Header_00336260;
  (this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00324a68;
  KVar1 = (FiringEntID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_FiringEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (FiringEntID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_FiringEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00324708;
  *(undefined2 *)&(this->m_FiringEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(FiringEntID->super_SimulationIdentifier).field_0xc;
  (this->m_TargetEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00324a68;
  KVar1 = (TargetEntID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_TargetEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (TargetEntID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_TargetEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_TargetEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00324708;
  *(undefined2 *)&(this->m_TargetEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(TargetEntID->super_SimulationIdentifier).field_0xc;
  (this->m_MunitionID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00324a68;
  KVar1 = (MunitionID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_MunitionID).super_SimulationIdentifier.m_ui16SiteID =
       (MunitionID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_MunitionID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_MunitionID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00324708;
  *(undefined2 *)&(this->m_MunitionID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(MunitionID->super_SimulationIdentifier).field_0xc;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00324a68;
  KVar1 = (EventID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16SiteID =
       (EventID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00324708;
  *(undefined2 *)&(this->m_EventID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EventID->super_SimulationIdentifier).field_0xc;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Warfare_Header::Warfare_Header( const EntityIdentifier & FiringEntID, const EntityIdentifier & TargetEntID, const EntityIdentifier & MunitionID, const EntityIdentifier & EventID ) :
    m_FiringEntityID( FiringEntID ),
    m_TargetEntityID( TargetEntID ),
    m_MunitionID( MunitionID ),
    m_EventID( EventID )
{
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}